

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roialign_x86.cpp
# Opt level: O1

void ncnn::detectron2_pre_calc_for_bilinear_interpolate<float>
               (int height,int width,int pooled_height,int pooled_width,int iy_upper,int ix_upper,
               float roi_start_h,float roi_start_w,float bin_size_h,float bin_size_w,
               int roi_bin_grid_h,int roi_bin_grid_w,
               vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> *pre_calc)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  pointer pPVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  float fVar16;
  float fVar17;
  
  if (0 < pooled_height) {
    iVar9 = height + -1;
    iVar4 = width + -1;
    iVar10 = 0;
    iVar5 = 0;
    do {
      if (0 < pooled_width) {
        iVar6 = 0;
        do {
          if (0 < iy_upper) {
            iVar15 = 0;
            do {
              if (0 < ix_upper) {
                fVar16 = ((float)iVar15 + 0.5) * bin_size_h * (1.0 / (float)roi_bin_grid_h) +
                         (float)iVar5 * bin_size_h + roi_start_h;
                bVar1 = fVar16 < -1.0;
                bVar2 = (float)height < fVar16;
                if (fVar16 <= 0.0) {
                  fVar16 = 0.0;
                }
                iVar13 = (int)fVar16;
                iVar14 = iVar13 + 1;
                if (iVar9 <= iVar13) {
                  iVar14 = iVar9;
                }
                iVar3 = iVar13;
                if (iVar9 < iVar13) {
                  iVar3 = iVar9;
                }
                if (iVar9 <= iVar13) {
                  fVar16 = (float)iVar9;
                }
                fVar16 = fVar16 - (float)iVar3;
                pPVar8 = (pre_calc->
                         super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + iVar10;
                iVar13 = 0;
                do {
                  fVar17 = ((float)iVar13 + 0.5) * bin_size_w * (1.0 / (float)roi_bin_grid_w) +
                           (float)iVar6 * bin_size_w + roi_start_w;
                  if ((fVar17 < -1.0 || (bVar1 || bVar2)) || ((float)width < fVar17)) {
                    pPVar8->w1 = 0.0;
                    pPVar8->w2 = 0.0;
                    pPVar8->w3 = 0.0;
                    pPVar8->w4 = 0.0;
                    pPVar8->pos1 = 0;
                    pPVar8->pos2 = 0;
                    pPVar8->pos3 = 0;
                    pPVar8->pos4 = 0;
                  }
                  else {
                    if (fVar17 <= 0.0) {
                      fVar17 = 0.0;
                    }
                    iVar11 = (int)fVar17;
                    iVar7 = iVar11 + 1;
                    if (iVar4 <= iVar11) {
                      iVar7 = iVar4;
                    }
                    iVar12 = iVar11;
                    if (iVar4 < iVar11) {
                      iVar12 = iVar4;
                    }
                    if (iVar4 <= iVar11) {
                      fVar17 = (float)iVar4;
                    }
                    pPVar8->pos1 = iVar12 + iVar3 * width;
                    pPVar8->pos2 = iVar7 + iVar3 * width;
                    pPVar8->pos3 = iVar12 + iVar14 * width;
                    pPVar8->pos4 = iVar7 + iVar14 * width;
                    fVar17 = fVar17 - (float)iVar12;
                    pPVar8->w1 = (1.0 - fVar17) * (1.0 - fVar16);
                    pPVar8->w2 = fVar17 * (1.0 - fVar16);
                    pPVar8->w3 = (1.0 - fVar17) * fVar16;
                    pPVar8->w4 = fVar17 * fVar16;
                  }
                  iVar13 = iVar13 + 1;
                  pPVar8 = pPVar8 + 1;
                } while (ix_upper != iVar13);
                iVar10 = iVar10 + iVar13;
              }
              iVar15 = iVar15 + 1;
            } while (iVar15 != iy_upper);
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 != pooled_width);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != pooled_height);
  }
  return;
}

Assistant:

void detectron2_pre_calc_for_bilinear_interpolate(
    const int height,
    const int width,
    const int pooled_height,
    const int pooled_width,
    const int iy_upper,
    const int ix_upper,
    T roi_start_h,
    T roi_start_w,
    T bin_size_h,
    T bin_size_w,
    int roi_bin_grid_h,
    int roi_bin_grid_w,
    std::vector<PreCalc<T> >& pre_calc)
{
    int pre_calc_index = 0;
    for (int ph = 0; ph < pooled_height; ph++)
    {
        for (int pw = 0; pw < pooled_width; pw++)
        {
            for (int iy = 0; iy < iy_upper; iy++)
            {
                const T yy = roi_start_h + ph * bin_size_h + static_cast<T>(iy + .5f) * bin_size_h / static_cast<T>(roi_bin_grid_h); // e.g., 0.5, 1.5
                for (int ix = 0; ix < ix_upper; ix++)
                {
                    const T xx = roi_start_w + pw * bin_size_w + static_cast<T>(ix + .5f) * bin_size_w / static_cast<T>(roi_bin_grid_w);

                    T x = xx;
                    T y = yy;
                    // deal with: inverse elements are out of feature map boundary
                    if (y < -1.0 || y > height || x < -1.0 || x > width)
                    {
                        // empty
                        PreCalc<T> pc;
                        pc.pos1 = 0;
                        pc.pos2 = 0;
                        pc.pos3 = 0;
                        pc.pos4 = 0;
                        pc.w1 = 0;
                        pc.w2 = 0;
                        pc.w3 = 0;
                        pc.w4 = 0;
                        pre_calc[pre_calc_index++] = pc;
                        continue;
                    }

                    if (y <= 0)
                    {
                        y = 0;
                    }
                    if (x <= 0)
                    {
                        x = 0;
                    }

                    int y_low = (int)y;
                    int x_low = (int)x;
                    int y_high;
                    int x_high;

                    if (y_low >= height - 1)
                    {
                        y_high = y_low = height - 1;
                        y = (T)y_low;
                    }
                    else
                    {
                        y_high = y_low + 1;
                    }

                    if (x_low >= width - 1)
                    {
                        x_high = x_low = width - 1;
                        x = (T)x_low;
                    }
                    else
                    {
                        x_high = x_low + 1;
                    }

                    T ly = y - y_low;
                    T lx = x - x_low;
                    T hy = (T)(1. - ly), hx = (T)(1. - lx);
                    T w1 = hy * hx, w2 = hy * lx, w3 = ly * hx, w4 = ly * lx;

                    // save weights and indices
                    PreCalc<T> pc;
                    pc.pos1 = y_low * width + x_low;
                    pc.pos2 = y_low * width + x_high;
                    pc.pos3 = y_high * width + x_low;
                    pc.pos4 = y_high * width + x_high;
                    pc.w1 = w1;
                    pc.w2 = w2;
                    pc.w3 = w3;
                    pc.w4 = w4;
                    pre_calc[pre_calc_index++] = pc;
                }
            }
        }
    }
}